

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

int bssl::dtls1_flush(SSL *ssl)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  DTLSSentRecord t;
  SSL *pSVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  uint16_t uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  DTLSRecordNumber *pDVar16;
  uchar *puVar17;
  size_t sVar18;
  DTLSMessageBitmap *pDVar19;
  pointer __p_00;
  uint uVar20;
  int in_EDX;
  pointer __p;
  ulong uVar21;
  uint8_t *puVar22;
  ulong uVar23;
  ulong uVar24;
  char *pcVar25;
  DTLS1_STATE *pDVar26;
  long lVar27;
  size_t in_R9;
  char *pcVar28;
  int iVar29;
  long lVar30;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  OPENSSL_timeval now;
  Range RVar31;
  size_t local_690;
  uint8_t *local_680;
  Array<unsigned_char> local_678;
  uint8_t *local_668;
  SSL *local_660;
  size_t local_658;
  uint32_t local_650;
  int local_64c;
  uint8_t *local_648;
  ulong local_640;
  ulong local_638;
  long local_630;
  size_t local_628;
  DTLSMessageBitmap *local_620;
  size_t record_len;
  ulong local_610;
  CBB cbb;
  CBB child;
  InplaceVector<bssl::DTLSRecordNumber,_32UL> sorted;
  uint8_t record [584];
  uint8_t buf [514];
  
  if ((undefined1  [1016])((undefined1  [1016])*ssl->d1 & (undefined1  [1016])0x40) !=
      (undefined1  [1016])0x0) {
    uVar11 = ssl_protocol_version(ssl);
    if (uVar11 < 0x304) {
      __assert_fail("ssl_protocol_version(ssl) >= TLS1_3_VERSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x3c2,"int bssl::send_ack(SSL *)");
    }
    dtls1_update_mtu(ssl);
    sVar14 = dtls_seal_max_input_len
                       (ssl,*(uint16_t *)((long)&(ssl->d1->write_epoch).next_record.combined_ + 6),
                        (ulong)ssl->d1->mtu);
    if (sVar14 < 0x12) {
      ERR_put_error(0x10,0,0xa9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x3ca);
      in_EDX = -1;
    }
    else {
      uVar15 = sVar14 - 2 >> 4;
      pDVar26 = ssl->d1;
      uVar23 = (ulong)(pDVar26->records_to_ack).storage_.size_;
      sorted.size_ = '\0';
      uVar21 = 0;
      if (uVar15 <= uVar23) {
        uVar21 = uVar23 - uVar15;
      }
      if (uVar21 < uVar23) {
        do {
          pDVar16 = MRUQueue<bssl::DTLSRecordNumber,_32UL>::operator[]
                              (&pDVar26->records_to_ack,uVar21);
          if (0x1f < (ulong)sorted.size_) {
            abort();
          }
          *(uint64_t *)(sorted.storage_ + (ulong)sorted.size_ * 8) = pDVar16->combined_;
          sorted.size_ = sorted.size_ + '\x01';
          uVar21 = uVar21 + 1;
          pDVar26 = ssl->d1;
        } while (uVar21 < (pDVar26->records_to_ack).storage_.size_);
      }
      uVar21 = (ulong)sorted.size_;
      if (sorted.size_ != '\0') {
        lVar30 = 0x3f;
        if (uVar21 != 0) {
          for (; sorted.size_ >> lVar30 == 0; lVar30 = lVar30 + -1) {
          }
        }
        std::__introsort_loop<bssl::DTLSRecordNumber*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (&sorted,sorted.storage_ + uVar21 * 8,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<bssl::DTLSRecordNumber*,__gnu_cxx::__ops::_Iter_less_iter>
                  (&sorted,sorted.storage_ + uVar21 * 8);
      }
      CBB_init_fixed(&cbb,buf,0x202);
      iVar29 = CBB_add_u16_length_prefixed(&cbb,&child);
      if (iVar29 == 0) {
        abort();
      }
      if (sorted.size_ != '\0') {
        uVar21 = (ulong)sorted.size_;
        lVar30 = 0;
        do {
          iVar29 = CBB_add_u64(&child,(ulong)*(ushort *)(sorted.storage_ + lVar30 + 6));
          if (iVar29 == 0) {
            abort();
          }
          iVar29 = CBB_add_u64(&child,*(ulong *)(sorted.storage_ + lVar30) & 0xffffffffffff);
          if (iVar29 == 0) {
            abort();
          }
          lVar30 = lVar30 + 8;
        } while (uVar21 * 8 != lVar30);
      }
      iVar29 = CBB_flush(&cbb);
      if (iVar29 == 0) {
        abort();
      }
      local_678.data_ = (uint8_t *)0x0;
      puVar22 = CBB_data(&cbb);
      sVar14 = CBB_len(&cbb);
      in_R9 = 0x1a;
      bVar7 = dtls_seal_record(ssl,(DTLSRecordNumber *)&local_678,record,&record_len,0x248,'\x1a',
                               puVar22,sVar14,
                               *(uint16_t *)
                                ((long)&(ssl->d1->write_epoch).next_record.combined_ + 6));
      in_EDX = -1;
      if (bVar7) {
        puVar22 = CBB_data(&cbb);
        puVar17 = (uchar *)CBB_len(&cbb);
        in.size_ = in_R9;
        in.data_ = puVar17;
        ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x1a,(int)puVar22,in);
        in_EDX = BIO_write((BIO *)(ssl->wbio)._M_t.
                                  super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,record,
                           (int)record_len);
        if (0 < in_EDX) {
          iVar29 = BIO_flush((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>
                             ._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
          in_EDX = 1;
          if (0 < iVar29) goto LAB_0016f634;
          in_EDX = -1;
        }
        ssl->s3->rwstate = 3;
      }
    }
LAB_0016f634:
    if (in_EDX < 1) {
      return in_EDX;
    }
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffbf;
  }
  if ((undefined1  [1016])((undefined1  [1016])*ssl->d1 & (undefined1  [1016])0x20) ==
      (undefined1  [1016])0x0) {
    return 1;
  }
  if (ssl->s3->write_shutdown == ssl_shutdown_none) {
    if ((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (bio_st *)0x0) {
      iVar29 = 0x77;
      iVar13 = 0x36e;
    }
    else {
      if (ssl->d1->num_timeouts < 0xd) {
        dtls1_update_mtu(ssl);
        local_678.data_ = (uint8_t *)0x0;
        local_678.size_ = 0;
        bVar7 = Array<unsigned_char>::InitUninitialized(&local_678,(ulong)ssl->d1->mtu);
        iVar29 = -1;
        pSVar6 = ssl;
        if (bVar7) {
          do {
            local_660 = pSVar6;
            pDVar26 = ssl->d1;
            bVar2 = pDVar26->outgoing_written;
            if ((pDVar26->outgoing_messages).size_ <= bVar2) {
              iVar13 = BIO_flush((ssl->wbio)._M_t.
                                 super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
              iVar29 = 1;
              if (iVar13 < 1) {
                ssl->s3->rwstate = 3;
                iVar29 = -1;
              }
              break;
            }
            local_650 = pDVar26->outgoing_offset;
            local_680 = local_678.data_;
            local_690 = local_678.size_;
            lVar30 = 0;
            do {
              local_658 = 0;
              pDVar26 = ssl->d1;
              bVar3 = (pDVar26->outgoing_messages).size_;
              bVar4 = pDVar26->outgoing_written;
              iVar13 = 2;
              if (bVar4 < bVar3) {
                uVar21 = (ulong)((uint)bVar4 * 0x30);
                pcVar28 = (pDVar26->outgoing_messages).storage_ + uVar21;
                if (((pDVar26->outgoing_messages).storage_[uVar21 + 0x12] == '\0') &&
                   (*(long *)((pDVar26->outgoing_messages).storage_ + uVar21 + 0x20) == 0)) {
                  lVar27 = 0;
                  pcVar25 = (pDVar26->outgoing_messages).storage_ + (uint)bVar4 * 0x30;
                  do {
                    if (((ulong)bVar4 - (ulong)bVar3) + 1 == lVar27) {
                      pDVar26->outgoing_offset = 0;
                      pDVar26->outgoing_written = bVar3;
                      goto LAB_0016ff23;
                    }
                    lVar27 = lVar27 + -1;
                    pcVar28 = pcVar25 + 0x30;
                  } while ((pcVar25[0x42] == '\0') &&
                          (pcVar1 = pcVar25 + 0x50, pcVar25 = pcVar28, *(long *)pcVar1 == 0));
                  pDVar26->outgoing_offset = 0;
                  pDVar26->outgoing_written = bVar4 - (char)lVar27;
                }
                sVar18 = dtls_seal_prefix_len(ssl,*(uint16_t *)(pcVar28 + 0x10));
                sVar14 = dtls_seal_max_input_len(ssl,*(uint16_t *)(pcVar28 + 0x10),local_690);
                if (sVar14 != 0) {
                  if (pcVar28[0x12] == '\x01') {
                    record[0] = '\0';
                    record[1] = '\0';
                    record[2] = '\0';
                    record[3] = '\0';
                    record[4] = '\0';
                    record[5] = '\0';
                    record[6] = '\0';
                    record[7] = '\0';
                    in_R9 = 0x14;
                    bVar7 = dtls_seal_record(ssl,(DTLSRecordNumber *)record,local_680,&local_658,
                                             local_690,'\x14',
                                             "\x01/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                             ,1,*(uint16_t *)(pcVar28 + 0x10));
                    iVar13 = 0;
                    if (bVar7) {
                      in_00.size_ = in_R9;
                      in_00.data_ = (uchar *)0x1;
                      ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x14,0x254724,in_00);
                      pDVar26 = ssl->d1;
                      pDVar26->outgoing_offset = 0;
                      puVar22 = &pDVar26->outgoing_written;
                      *puVar22 = *puVar22 + '\x01';
                      iVar13 = 1;
                    }
                  }
                  else {
                    if (local_690 < sVar18) {
                      abort();
                    }
                    sVar5 = *(short *)(pcVar28 + 0x10);
                    puVar22 = local_680 + sVar18;
                    if (local_690 - sVar18 < sVar14) {
                      sVar14 = local_690 - sVar18;
                    }
                    CBB_init_fixed((CBB *)record,puVar22,sVar14);
                    bVar7 = false;
                    sorted.storage_[0] = '\0';
                    sorted.storage_[1] = '\0';
                    sorted.storage_[2] = '\0';
                    sorted.storage_[3] = '\0';
                    sorted.storage_[4] = '\0';
                    sorted.storage_[5] = '\0';
                    sorted.storage_[6] = '\0';
                    sorted.storage_[7] = '\0';
                    sorted.storage_[9] = '\0';
                    sorted.storage_[0x10] = '\0';
                    sorted.storage_[0x11] = '\0';
                    sorted.storage_[0x12] = '\0';
                    sorted.storage_[0x13] = '\0';
                    sorted.storage_[8] = ssl->d1->outgoing_written;
                    sorted.storage_._12_4_ = ssl->d1->outgoing_offset;
                    local_64c = (uint)(sVar5 == 0) * 5;
                    local_630 = lVar30;
                    local_628 = sVar14;
                    do {
                      pDVar26 = ssl->d1;
                      if ((pDVar26->outgoing_messages).size_ <= pDVar26->outgoing_written)
                      goto LAB_0016fd9b;
                      uVar21 = (ulong)((uint)pDVar26->outgoing_written * 0x30);
                      iVar13 = 5;
                      bVar9 = true;
                      if ((*(short *)((pDVar26->outgoing_messages).storage_ + uVar21 + 0x10) ==
                           *(short *)(pcVar28 + 0x10)) &&
                         (pDVar19 = (DTLSMessageBitmap *)
                                    ((pDVar26->outgoing_messages).storage_ + uVar21),
                         (pDVar26->outgoing_messages).storage_[uVar21 + 0x12] == '\0')) {
                        child.child = (CBB *)(pDVar19->bytes_).data_;
                        pcVar25 = (pDVar26->outgoing_messages).storage_ + uVar21 + 8;
                        child.is_child = pcVar25[0];
                        child._9_1_ = pcVar25[1];
                        child._10_1_ = pcVar25[2];
                        child._11_1_ = pcVar25[3];
                        child._12_1_ = pcVar25[4];
                        child._13_1_ = pcVar25[5];
                        child._14_1_ = pcVar25[6];
                        child._15_1_ = pcVar25[7];
                        local_620 = pDVar19;
                        bVar8 = dtls1_parse_fragment
                                          ((CBS *)&child,(hm_header_st *)&cbb,(CBS *)&record_len);
                        uVar21 = local_610;
                        bVar9 = bVar7;
                        if ((bVar8 && cbb._12_4_ == 0) &&
                           (((local_610 == (uint)cbb.u._0_4_ && (local_610 == cbb.child._4_4_)) &&
                            (child._8_8_ == 0)))) {
                          lVar30 = CONCAT44(record_len._4_4_,(int)record_len);
                          local_620 = local_620 + 1;
                          local_668 = puVar22;
                          do {
                            RVar31 = DTLSMessageBitmap::NextUnmarkedRange
                                               (local_620,(ulong)ssl->d1->outgoing_offset);
                            uVar15 = RVar31.start;
                            uVar23 = RVar31.end - uVar15;
                            if (uVar23 == 0) {
                              pDVar26 = ssl->d1;
                              pDVar26->outgoing_offset = 0;
                              puVar22 = &pDVar26->outgoing_written;
                              *puVar22 = *puVar22 + '\x01';
                              iVar13 = 6;
                            }
                            else {
                              sVar14 = CBB_len((CBB *)record);
                              iVar13 = 8;
                              if (0xc < local_628 - sVar14) {
                                uVar24 = (local_628 - sVar14) - 0xc;
                                local_638 = uVar23;
                                if (uVar24 < uVar23) {
                                  local_638 = uVar24;
                                }
                                local_640 = uVar15;
                                if (uVar21 == 0) {
                                  local_648 = (uint8_t *)0x0;
                                  sVar14 = 0;
                                }
                                else {
                                  if (uVar21 < uVar15) {
                                    abort();
                                  }
                                  local_648 = (uint8_t *)(lVar30 + uVar15);
                                  sVar14 = uVar21 - uVar15;
                                  if (local_638 <= uVar21 - uVar15) {
                                    sVar14 = local_638;
                                  }
                                }
                                sVar18 = CBB_len((CBB *)record);
                                iVar13 = CBB_add_u8((CBB *)record,(uint8_t)cbb.child);
                                if (((((iVar13 == 0) ||
                                      (iVar13 = CBB_add_u24((CBB *)record,cbb.child._4_4_),
                                      iVar13 == 0)) ||
                                     ((iVar13 = CBB_add_u16((CBB *)record,cbb._8_2_), iVar13 == 0 ||
                                      ((iVar13 = CBB_add_u24((CBB *)record,(uint32_t)local_640),
                                       iVar13 == 0 ||
                                       (iVar13 = CBB_add_u24_length_prefixed
                                                           ((CBB *)record,(CBB *)buf), iVar13 == 0))
                                      )))) || (iVar13 = CBB_add_bytes((CBB *)buf,local_648,sVar14),
                                              iVar13 == 0)) ||
                                   (iVar13 = CBB_flush((CBB *)record), iVar13 == 0)) {
                                  iVar13 = 1;
                                  ERR_put_error(0x10,0,0x44,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                                ,0x313);
                                }
                                else {
                                  sVar14 = CBB_len((CBB *)record);
                                  if (local_628 < sVar18) {
                                    abort();
                                  }
                                  puVar17 = (uchar *)(sVar14 - sVar18);
                                  if ((uchar *)(local_628 - sVar18) < (uchar *)(sVar14 - sVar18)) {
                                    puVar17 = (uchar *)(local_628 - sVar18);
                                  }
                                  in_01.size_ = in_R9;
                                  in_01.data_ = puVar17;
                                  ssl_do_msg_callback((bssl *)local_660,(SSL *)0x1,0x16,
                                                      (int)sVar18 + (int)local_668,in_01);
                                  local_660->d1->outgoing_offset = (int)local_638 + (int)local_640;
                                  iVar13 = (uint)(uVar24 < uVar23) << 3;
                                }
                              }
                            }
                            ssl = local_660;
                          } while (iVar13 == 0);
                          puVar22 = local_668;
                          if ((iVar13 == 6) && (iVar13 = local_64c, sVar5 == 0)) {
                            bVar9 = true;
                          }
                        }
                        else {
                          ERR_put_error(0x10,0,0x44,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                        ,0x2ec);
                          iVar13 = 1;
                        }
                      }
                      bVar7 = bVar9;
                    } while (iVar13 == 0);
                    if ((iVar13 == 8) || (iVar13 == 5)) {
LAB_0016fd9b:
                      sorted.storage_[9] = ssl->d1->outgoing_written;
                      sorted.storage_._16_4_ = ssl->d1->outgoing_offset;
                      sVar14 = CBB_len((CBB *)record);
                      lVar30 = local_630;
                      if (sVar14 == 0) {
                        iVar13 = 2;
                        if (bVar7) {
                          __assert_fail("!should_continue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                        ,0x331,
                                        "seal_result_t bssl::seal_next_record(SSL *, Span<uint8_t>, size_t *)"
                                       );
                        }
                      }
                      else {
                        puVar22 = CBB_data((CBB *)record);
                        sVar14 = CBB_len((CBB *)record);
                        in_R9 = 0x16;
                        bVar9 = dtls_seal_record(ssl,(DTLSRecordNumber *)&sorted,local_680,
                                                 &local_658,local_690,'\x16',puVar22,sVar14,
                                                 *(uint16_t *)(pcVar28 + 0x10));
                        iVar13 = 0;
                        if (bVar9) {
                          if ((ssl->s3->version == 0) ||
                             (uVar11 = ssl_protocol_version(ssl), 0x303 < uVar11)) {
                            if ((ssl->d1->sent_records)._M_t.
                                super___uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_bssl::internal::Deleter>
                                .
                                super__Head_base<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_false>
                                ._M_head_impl == (MRUQueue<bssl::DTLSSentRecord,_32UL> *)0x0) {
                              __p_00 = (pointer)OPENSSL_malloc(0x310);
                              if (__p_00 == (pointer)0x0) {
                                __p_00 = (pointer)0x0;
                              }
                              else {
                                memset(__p_00,0,0x310);
                              }
                              buf[0] = '\0';
                              buf[1] = '\0';
                              buf[2] = '\0';
                              buf[3] = '\0';
                              buf[4] = '\0';
                              buf[5] = '\0';
                              buf[6] = '\0';
                              buf[7] = '\0';
                              std::
                              __uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                              ::reset((__uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                       *)&ssl->d1->sent_records,__p_00);
                              std::
                              unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                              ::~unique_ptr((unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                             *)buf);
                              if ((ssl->d1->sent_records)._M_t.
                                  super___uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_bssl::internal::Deleter>
                                  .
                                  super__Head_base<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_false>
                                  ._M_head_impl == (MRUQueue<bssl::DTLSSentRecord,_32UL> *)0x0)
                              goto LAB_0016ff23;
                            }
                            t.last_msg = sorted.storage_[9];
                            t.first_msg = sorted.storage_[8];
                            t._10_1_ = sorted.storage_[10];
                            t._11_1_ = sorted.storage_[0xb];
                            t.first_msg_start._0_1_ = sorted.storage_[0xc];
                            t.first_msg_start._1_1_ = sorted.storage_[0xd];
                            t.first_msg_start._2_1_ = sorted.storage_[0xe];
                            t.first_msg_start._3_1_ = sorted.storage_[0xf];
                            t.number.combined_._0_1_ = sorted.storage_[0];
                            t.number.combined_._1_1_ = sorted.storage_[1];
                            t.number.combined_._2_1_ = sorted.storage_[2];
                            t.number.combined_._3_1_ = sorted.storage_[3];
                            t.number.combined_._4_1_ = sorted.storage_[4];
                            t.number.combined_._5_1_ = sorted.storage_[5];
                            t.number.combined_._6_1_ = sorted.storage_[6];
                            t.number.combined_._7_1_ = sorted.storage_[7];
                            t.last_msg_end._0_2_ = sorted.storage_._16_2_;
                            t._18_6_ = (int6)(CONCAT44(sorted.storage_._20_4_,sorted.storage_._16_4_
                                                      ) >> 0x10);
                            MRUQueue<bssl::DTLSSentRecord,_32UL>::PushBack
                                      ((ssl->d1->sent_records)._M_t.
                                       super___uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_bssl::internal::Deleter>
                                       .
                                       super__Head_base<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_false>
                                       ._M_head_impl,t);
                          }
                          iVar13 = 2 - (uint)bVar7;
                        }
                      }
                    }
                    else {
                      iVar13 = 0;
                      lVar30 = local_630;
                    }
                  }
                }
              }
LAB_0016ff23:
              if (iVar13 == 0) {
                cVar10 = '\x01';
              }
              else {
                bVar7 = local_690 < local_658;
                local_690 = local_690 - local_658;
                if (bVar7) {
                  abort();
                }
                lVar30 = lVar30 + local_658;
                local_680 = local_680 + local_658;
                cVar10 = (iVar13 == 2) * '\x02';
              }
            } while (cVar10 == '\0');
            if (cVar10 == '\x02') {
              if (lVar30 == 0) {
                bVar7 = true;
                if (ssl->d1->outgoing_written < (ssl->d1->outgoing_messages).size_) {
                  bVar7 = false;
                  ERR_put_error(0x10,0,0xa9,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                ,0x38b);
                  iVar29 = 0;
                }
              }
              else {
                iVar13 = BIO_write((BIO *)(ssl->wbio)._M_t.
                                          super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                                   local_678.data_,(int)lVar30);
                bVar7 = 0 < iVar13;
                if (iVar13 < 1) {
                  pDVar26 = ssl->d1;
                  pDVar26->outgoing_written = bVar2;
                  pDVar26->outgoing_offset = local_650;
                  ssl->s3->rwstate = 3;
                  bVar7 = false;
                  iVar29 = iVar13;
                }
              }
            }
            else {
              iVar29 = -1;
              bVar7 = false;
            }
            pSVar6 = local_660;
          } while (bVar7);
        }
        OPENSSL_free(local_678.data_);
        goto LAB_0016f68a;
      }
      iVar29 = 0xc6;
      iVar13 = 0x373;
    }
  }
  else {
    iVar29 = 0xc2;
    iVar13 = 0x369;
  }
  ERR_put_error(0x10,0,iVar29,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                ,iVar13);
  iVar29 = -1;
LAB_0016f68a:
  iVar13 = iVar29;
  if (0 < iVar29) {
    pDVar26 = ssl->d1;
    pDVar26->outgoing_written = '\0';
    pDVar26->outgoing_offset = 0;
    *(byte *)pDVar26 = *(byte *)pDVar26 & 0xdf;
    iVar12 = SSL_in_init(ssl);
    iVar13 = in_EDX;
    if ((iVar12 != 0) || (uVar11 = ssl_protocol_version(ssl), 0x303 < uVar11)) {
      pDVar26 = ssl->d1;
      if (pDVar26->num_timeouts == 0) {
        uVar20 = ssl->initial_timeout_duration_ms;
      }
      else {
        uVar20 = pDVar26->timeout_duration_ms * 2;
        if (59999 < uVar20) {
          uVar20 = 60000;
        }
      }
      pDVar26->timeout_duration_ms = uVar20;
      now = ssl_ctx_get_current_time
                      ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      DTLSTimer::StartMicroseconds
                (&ssl->d1->retransmit_timer,now,(ulong)ssl->d1->timeout_duration_ms * 1000);
    }
  }
  if (0 < iVar29) {
    return 1;
  }
  return iVar13;
}

Assistant:

int dtls1_flush(SSL *ssl) {
  // Send the pending ACK, if any.
  if (ssl->d1->sending_ack) {
    int ret = send_ack(ssl);
    if (ret <= 0) {
      return ret;
    }
    ssl->d1->sending_ack = false;
  }

  // Send the pending flight, if any.
  if (ssl->d1->sending_flight) {
    int ret = send_flight(ssl);
    if (ret <= 0) {
      return ret;
    }

    // Reset state for the next send.
    ssl->d1->outgoing_written = 0;
    ssl->d1->outgoing_offset = 0;
    ssl->d1->sending_flight = false;

    // Schedule the next retransmit timer. In DTLS 1.3, we retransmit all
    // flights until ACKed. In DTLS 1.2, the final Finished flight is never
    // ACKed, so we do not keep the timer running after the handshake.
    if (SSL_in_init(ssl) || ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      if (ssl->d1->num_timeouts == 0) {
        ssl->d1->timeout_duration_ms = ssl->initial_timeout_duration_ms;
      } else {
        ssl->d1->timeout_duration_ms =
            std::min(ssl->d1->timeout_duration_ms * 2, uint32_t{60000});
      }

      OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
      ssl->d1->retransmit_timer.StartMicroseconds(
          now, uint64_t{ssl->d1->timeout_duration_ms} * 1000);
    }
  }

  return 1;
}